

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getnameinfo.c
# Opt level: O2

int run_test_getnameinfo_basic_ip4_sync(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  undefined8 uStack_10;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x50,&addr4);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_getnameinfo(puVar2,&req,(uv_getnameinfo_cb)0x0,(sockaddr *)&addr4,0);
    if (iVar1 == 0) {
      if (req.host[0] == '\0') {
        pcVar3 = "req.host[0] != \'\\0\'";
        uStack_10 = 0x4c;
      }
      else if (req.service[0] == '\0') {
        pcVar3 = "req.service[0] != \'\\0\'";
        uStack_10 = 0x4d;
      }
      else {
        puVar2 = uv_default_loop();
        close_loop(puVar2);
        puVar2 = uv_default_loop();
        iVar1 = uv_loop_close(puVar2);
        if (iVar1 == 0) {
          return 0;
        }
        pcVar3 = "0 == uv_loop_close(uv_default_loop())";
        uStack_10 = 0x4f;
      }
    }
    else {
      pcVar3 = 
      "0 == uv_getnameinfo(uv_default_loop(), &req, NULL, (const struct sockaddr*)&addr4, 0)";
      uStack_10 = 0x4b;
    }
  }
  else {
    pcVar3 = "0 == uv_ip4_addr(address_ip4, port, &addr4)";
    uStack_10 = 0x45;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getnameinfo.c"
          ,uStack_10,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(getnameinfo_basic_ip4_sync) {
  ASSERT(0 == uv_ip4_addr(address_ip4, port, &addr4));

  ASSERT(0 == uv_getnameinfo(uv_default_loop(),
                             &req,
                             NULL,
                             (const struct sockaddr*)&addr4,
                             0));
  ASSERT(req.host[0] != '\0');
  ASSERT(req.service[0] != '\0');

  MAKE_VALGRIND_HAPPY();
  return 0;
}